

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O0

EC_KEY * EC_KEY_parse_private_key(CBS *cbs,EC_GROUP *group)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  pointer peVar5;
  uint8_t *puVar6;
  BIGNUM *pBVar7;
  EC_POINT *pEVar8;
  byte *pbVar9;
  uint8_t local_99;
  undefined1 local_98 [7];
  uint8_t padding;
  CBS public_key;
  CBS child_1;
  UniquePtr<BIGNUM> priv_key;
  unique_ptr<ec_key_st,_bssl::internal::Deleter> local_68;
  UniquePtr<EC_KEY> ret;
  EC_GROUP *inner_group;
  CBS child;
  uint64_t version;
  CBS private_key;
  CBS ec_private_key;
  EC_GROUP *group_local;
  CBS *cbs_local;
  
  iVar3 = CBS_get_asn1(cbs,(CBS *)&private_key.len,0x20000010);
  if ((((iVar3 == 0) ||
       (iVar3 = CBS_get_asn1_uint64((CBS *)&private_key.len,&child.len), iVar3 == 0)) ||
      (child.len != 1)) ||
     (iVar3 = CBS_get_asn1((CBS *)&private_key.len,(CBS *)&version,4), iVar3 == 0)) {
    ERR_put_error(0xf,0,0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,0x35);
    return (EC_KEY *)0x0;
  }
  iVar3 = CBS_peek_asn1_tag((CBS *)&private_key.len,0xa0000000);
  ec_private_key.len = (size_t)group;
  if (iVar3 != 0) {
    iVar3 = CBS_get_asn1((CBS *)&private_key.len,(CBS *)&inner_group,0xa0000000);
    if (iVar3 == 0) {
      ERR_put_error(0xf,0,0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                    ,0x41);
      return (EC_KEY *)0x0;
    }
    ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
         EC_KEY_parse_parameters((CBS *)&inner_group);
    if ((tuple<ec_key_st_*,_bssl::internal::Deleter>)
        ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_ec_key_st_*,_false>)0x0) {
      return (EC_KEY *)0x0;
    }
    ec_private_key.len =
         (size_t)ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl;
    if ((group != (EC_GROUP *)0x0) &&
       (iVar3 = EC_GROUP_cmp((EC_GROUP *)group,
                             (EC_GROUP *)
                             ret._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t
                             .super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,(BN_CTX *)0x0),
       ec_private_key.len = (size_t)group, iVar3 != 0)) {
      ERR_put_error(0xf,0,0x82,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                    ,0x4c);
      return (EC_KEY *)0x0;
    }
    sVar4 = CBS_len((CBS *)&inner_group);
    if (sVar4 != 0) {
      ERR_put_error(0xf,0,0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                    ,0x50);
      return (EC_KEY *)0x0;
    }
  }
  if (ec_private_key.len == 0) {
    ERR_put_error(0xf,0,0x72,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,0x56);
    return (EC_KEY *)0x0;
  }
  peVar5 = (pointer)EC_KEY_new();
  std::unique_ptr<ec_key_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ec_key_st,bssl::internal::Deleter> *)&local_68,peVar5);
  bVar2 = std::operator==(&local_68,(nullptr_t)0x0);
  if (!bVar2) {
    peVar5 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get(&local_68);
    iVar3 = EC_KEY_set_group((EC_KEY *)peVar5,(EC_GROUP *)ec_private_key.len);
    if (iVar3 != 0) {
      puVar6 = CBS_data((CBS *)&version);
      sVar4 = CBS_len((CBS *)&version);
      pBVar7 = BN_bin2bn(puVar6,(int)sVar4,(BIGNUM *)0x0);
      std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&child_1.len,(pointer)pBVar7);
      pEVar8 = (EC_POINT *)EC_POINT_new((EC_GROUP *)ec_private_key.len);
      peVar5 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::operator->(&local_68);
      peVar5->pub_key = pEVar8;
      bVar2 = std::operator==((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&child_1.len,
                              (nullptr_t)0x0);
      if ((bVar2) ||
         (peVar5 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::operator->(&local_68),
         peVar5->pub_key == (EC_POINT *)0x0)) {
LAB_0022122b:
        cbs_local = (CBS *)0x0;
      }
      else {
        peVar5 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get(&local_68);
        pBVar7 = (BIGNUM *)
                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&child_1.len);
        iVar3 = EC_KEY_set_private_key((EC_KEY *)peVar5,pBVar7);
        if (iVar3 == 0) goto LAB_0022122b;
        iVar3 = CBS_peek_asn1_tag((CBS *)&private_key.len,0xa0000001);
        if (iVar3 == 0) {
          peVar5 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::operator->(&local_68);
          pEVar8 = peVar5->pub_key;
          peVar5 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::operator->(&local_68);
          iVar3 = ec_point_mul_scalar_base
                            ((EC_GROUP *)ec_private_key.len,&pEVar8->raw,&peVar5->priv_key->scalar);
          if (iVar3 == 0) {
            cbs_local = (CBS *)0x0;
          }
          else {
            peVar5 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::operator->(&local_68);
            peVar5->enc_flag = peVar5->enc_flag | 2;
LAB_00221411:
            sVar4 = CBS_len((CBS *)&private_key.len);
            if (sVar4 == 0) {
              peVar5 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get(&local_68);
              iVar3 = EC_KEY_check_key((EC_KEY *)peVar5);
              if (iVar3 == 0) {
                cbs_local = (CBS *)0x0;
              }
              else {
                cbs_local = (CBS *)std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::release
                                             (&local_68);
              }
            }
            else {
              ERR_put_error(0xf,0,0x80,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                            ,0x8d);
              cbs_local = (CBS *)0x0;
            }
          }
        }
        else {
          iVar3 = CBS_get_asn1((CBS *)&private_key.len,(CBS *)&public_key.len,0xa0000001);
          if ((((iVar3 != 0) &&
               (iVar3 = CBS_get_asn1((CBS *)&public_key.len,(CBS *)local_98,3), iVar3 != 0)) &&
              (iVar3 = CBS_get_u8((CBS *)local_98,&local_99), iVar3 != 0)) &&
             ((local_99 == '\0' && (sVar4 = CBS_len((CBS *)local_98), sVar4 != 0)))) {
            peVar5 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::operator->(&local_68);
            pEVar8 = peVar5->pub_key;
            puVar6 = CBS_data((CBS *)local_98);
            sVar4 = CBS_len((CBS *)local_98);
            iVar3 = EC_POINT_oct2point((EC_GROUP *)ec_private_key.len,(EC_POINT *)pEVar8,puVar6,
                                       sVar4,(BN_CTX *)0x0);
            if ((iVar3 != 0) && (sVar4 = CBS_len((CBS *)&public_key.len), sVar4 == 0)) {
              pbVar9 = CBS_data((CBS *)local_98);
              bVar1 = *pbVar9;
              peVar5 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::operator->(&local_68);
              peVar5->conv_form = bVar1 & 0xfffffffe;
              goto LAB_00221411;
            }
          }
          ERR_put_error(0xf,0,0x80,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                        ,0x79);
          cbs_local = (CBS *)0x0;
        }
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&child_1.len);
      goto LAB_00221493;
    }
  }
  cbs_local = (CBS *)0x0;
LAB_00221493:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&local_68);
  return (EC_KEY *)cbs_local;
}

Assistant:

EC_KEY *EC_KEY_parse_private_key(CBS *cbs, const EC_GROUP *group) {
  CBS ec_private_key, private_key;
  uint64_t version;
  if (!CBS_get_asn1(cbs, &ec_private_key, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&ec_private_key, &version) ||  //
      version != 1 ||
      !CBS_get_asn1(&ec_private_key, &private_key, CBS_ASN1_OCTETSTRING)) {
    OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
    return nullptr;
  }

  // Parse the optional parameters field.
  if (CBS_peek_asn1_tag(&ec_private_key, kParametersTag)) {
    // Per SEC 1, as an alternative to omitting it, one is allowed to specify
    // this field and put in a NULL to mean inheriting this value. This was
    // omitted in a previous version of this logic without problems, so leave it
    // unimplemented.
    CBS child;
    if (!CBS_get_asn1(&ec_private_key, &child, kParametersTag)) {
      OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
      return nullptr;
    }
    const EC_GROUP *inner_group = EC_KEY_parse_parameters(&child);
    if (inner_group == nullptr) {
      return nullptr;
    }
    if (group == nullptr) {
      group = inner_group;
    } else if (EC_GROUP_cmp(group, inner_group, nullptr) != 0) {
      // If a group was supplied externally, it must match.
      OPENSSL_PUT_ERROR(EC, EC_R_GROUP_MISMATCH);
      return nullptr;
    }
    if (CBS_len(&child) != 0) {
      OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
      return nullptr;
    }
  }

  if (group == nullptr) {
    OPENSSL_PUT_ERROR(EC, EC_R_MISSING_PARAMETERS);
    return nullptr;
  }

  bssl::UniquePtr<EC_KEY> ret(EC_KEY_new());
  if (ret == nullptr || !EC_KEY_set_group(ret.get(), group)) {
    return nullptr;
  }

  // Although RFC 5915 specifies the length of the key, OpenSSL historically
  // got this wrong, so accept any length. See upstream's
  // 30cd4ff294252c4b6a4b69cbef6a5b4117705d22.
  bssl::UniquePtr<BIGNUM> priv_key(
      BN_bin2bn(CBS_data(&private_key), CBS_len(&private_key), nullptr));
  ret->pub_key = EC_POINT_new(group);
  if (priv_key == nullptr || ret->pub_key == nullptr ||
      !EC_KEY_set_private_key(ret.get(), priv_key.get())) {
    return nullptr;
  }

  if (CBS_peek_asn1_tag(&ec_private_key, kPublicKeyTag)) {
    CBS child, public_key;
    uint8_t padding;
    if (!CBS_get_asn1(&ec_private_key, &child, kPublicKeyTag) ||
        !CBS_get_asn1(&child, &public_key, CBS_ASN1_BITSTRING) ||
        // As in a SubjectPublicKeyInfo, the byte-encoded public key is then
        // encoded as a BIT STRING with bits ordered as in the DER encoding.
        !CBS_get_u8(&public_key, &padding) ||  //
        padding != 0 ||
        // Explicitly check |public_key| is non-empty to save the conversion
        // form later.
        CBS_len(&public_key) == 0 ||
        !EC_POINT_oct2point(group, ret->pub_key, CBS_data(&public_key),
                            CBS_len(&public_key), nullptr) ||
        CBS_len(&child) != 0) {
      OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
      return nullptr;
    }

    // Save the point conversion form.
    // TODO(davidben): Consider removing this.
    ret->conv_form =
        (point_conversion_form_t)(CBS_data(&public_key)[0] & ~0x01);
  } else {
    // Compute the public key instead.
    if (!ec_point_mul_scalar_base(group, &ret->pub_key->raw,
                                  &ret->priv_key->scalar)) {
      return nullptr;
    }
    // Remember the original private-key-only encoding.
    // TODO(davidben): Consider removing this.
    ret->enc_flag |= EC_PKEY_NO_PUBKEY;
  }

  if (CBS_len(&ec_private_key) != 0) {
    OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
    return nullptr;
  }

  // Ensure the resulting key is valid.
  if (!EC_KEY_check_key(ret.get())) {
    return nullptr;
  }

  return ret.release();
}